

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

void __thiscall
trun::TestResponseProxy::CaseDepends(TestResponseProxy *this,char *caseName,char *dependencyList)

{
  Ref testModule;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  TestModule *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  TestRunner::GetCurrentTestModule();
  if (local_28 != (TestModule *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,caseName,&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,dependencyList,&local_6a)
    ;
    TestModule::AddDependencyForCase(local_28,&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

void TestResponseProxy::CaseDepends(const char *caseName, const char *dependencyList) {
    auto testModule = TestRunner::GetCurrentTestModule();
    if (testModule != nullptr) {
        testModule->AddDependencyForCase(caseName, dependencyList);
    }
}